

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O2

void __thiscall
nn::ESoinn::initialize
          (ESoinn *this,pair<wv::AbstractWeightVector_*,_wv::AbstractWeightVector_*> *points,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *src_label)

{
  ConcreteLogger *pCVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar2;
  uint32_t uVar3;
  uint uVar4;
  WeightVectorPhrase *this_00;
  WeightVectorPhrase *this_01;
  uint32_t i;
  ulong uVar5;
  long lVar6;
  string local_128;
  string local_108;
  ESoinnNeuron local_e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_60;
  undefined1 local_58 [8];
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  coords2;
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  coords1;
  
  pCVar1 = log_netw;
  std::__cxx11::string::string
            ((string *)&local_e8,"Initialize network",(allocator *)&coords2.m_Size);
  logger::ConcreteLogger::debug(pCVar1,(string *)&local_e8,false);
  local_60 = src_label;
  std::__cxx11::string::~string((string *)&local_e8);
  uVar3 = (*points->first->_vptr_AbstractWeightVector[3])();
  cont::
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  StaticArray((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&coords2.m_Size,uVar3);
  uVar3 = (*points->second->_vptr_AbstractWeightVector[3])();
  cont::
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  StaticArray((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_58,uVar3);
  lVar6 = 0;
  uVar5 = 0;
  while( true ) {
    uVar4 = (*points->first->_vptr_AbstractWeightVector[3])();
    if (uVar4 <= uVar5) break;
    (*points->first->_vptr_AbstractWeightVector[2])(&local_e8,points->first,uVar5 & 0xffffffff);
    std::__cxx11::string::operator=((string *)(coords2._8_8_ + lVar6),(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x20;
  }
  lVar6 = 0;
  uVar5 = 0;
  while( true ) {
    uVar4 = (*points->second->_vptr_AbstractWeightVector[3])();
    if (uVar4 <= uVar5) break;
    (*points->second->_vptr_AbstractWeightVector[2])(&local_e8,points->second,uVar5 & 0xffffffff);
    std::__cxx11::string::operator=
              ((string *)((long)&((_Alloc_hider *)local_58)->_M_p + lVar6),(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x20;
  }
  this_00 = (WeightVectorPhrase *)operator_new(0x20);
  wv::WeightVectorPhrase::WeightVectorPhrase
            (this_00,(StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&coords2.m_Size,this->m_Distances);
  ppVar2 = local_60;
  this_01 = (WeightVectorPhrase *)operator_new(0x20);
  wv::WeightVectorPhrase::WeightVectorPhrase
            (this_01,(StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_58,this->m_Distances);
  std::__cxx11::string::string((string *)&local_128,(string *)ppVar2);
  neuron::ESoinnNeuron::ESoinnNeuron(&local_e8,(AbstractWeightVector *)this_00,&local_128);
  std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::
  emplace_back<neuron::ESoinnNeuron>(&this->m_Neurons,&local_e8);
  neuron::ESoinnNeuron::~ESoinnNeuron(&local_e8);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string((string *)&local_108,(string *)&ppVar2->second);
  neuron::ESoinnNeuron::ESoinnNeuron(&local_e8,(AbstractWeightVector *)this_01,&local_108);
  std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::
  emplace_back<neuron::ESoinnNeuron>(&this->m_Neurons,&local_e8);
  neuron::ESoinnNeuron::~ESoinnNeuron(&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  pCVar1 = log_netw;
  std::__cxx11::string::string
            ((string *)&local_e8,"Network is successfully initialized",
             (allocator *)&coords1.field_0xf);
  logger::ConcreteLogger::debug(pCVar1,(string *)&local_e8,false);
  std::__cxx11::string::~string((string *)&local_e8);
  cont::
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~StaticArray((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_58);
  cont::
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~StaticArray((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&coords2.m_Size);
  return;
}

Assistant:

void ESoinn::initialize(const std::pair<wv::Point*, wv::Point*>& points, const std::pair<std::string, std::string>& src_label)
    {
        log_netw->debug("Initialize network");
        //if (m_NumDimensions != points.first->getNumDimensions())
        //    throw std::runtime_error("Number of dimensions for data doesn't correspond dimension of neural network");
        cont::StaticArray<std::string> coords1(points.first->getNumDimensions());
        cont::StaticArray<std::string> coords2(points.second->getNumDimensions());

        for (uint32_t i = 0; i < points.first->getNumDimensions(); i++)
        {
            coords1[i] = points.first->getConcreteCoord(i);
        }
        
        for (uint32_t i = 0; i < points.second->getNumDimensions(); i++)
        {
            coords2[i] = points.second->getConcreteCoord(i);
        }
        
        wv::WeightVectorPhrase* sWeightVector1 = new wv::WeightVectorPhrase(coords1, m_Distances);
        wv::WeightVectorPhrase* sWeightVector2 = new wv::WeightVectorPhrase(coords2, m_Distances);
        m_Neurons.push_back(neuron::ESoinnNeuron(sWeightVector1, src_label.first));
        m_Neurons.push_back(neuron::ESoinnNeuron(sWeightVector2, src_label.second));
        
        log_netw->debug("Network is successfully initialized");
    }